

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tidy.c
# Opt level: O0

int main(int argc,char **argv)

{
  undefined8 uVar1;
  FILE *pFVar2;
  Bool BVar3;
  int iVar4;
  uint uVar5;
  ctmbstr ptVar6;
  ulong uVar7;
  ctmbstr ptVar8;
  uint local_c4;
  ctmbstr outfil;
  ctmbstr s;
  uint c;
  int nfields_1;
  uint acclvl;
  ctmbstr post_1;
  int nfields;
  uint wraplen;
  ctmbstr post;
  ctmbstr arg;
  uint accessWarnings;
  uint contentWarnings;
  uint contentErrors;
  int status;
  TidyDoc tdoc;
  ctmbstr htmlfil;
  ctmbstr errfil;
  ctmbstr cfgfil;
  ctmbstr prog;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  cfgfil = *argv;
  errfil = (ctmbstr)0x0;
  htmlfil = (ctmbstr)0x0;
  tdoc = (TidyDoc)0x0;
  _contentErrors = (TidyDoc)0x0;
  contentWarnings = 0;
  accessWarnings = 0;
  arg._4_4_ = 0;
  arg._0_4_ = 0;
  prog = (ctmbstr)argv;
  argv_local._0_4_ = argc;
  _contentErrors = tidyCreate();
  tidySetMessageCallback(_contentErrors,reportCallback);
  errout = _stderr;
  atexit(tidy_cleanup);
  BVar3 = tidyFileExists(_contentErrors,"/etc/tidy.conf");
  if ((BVar3 != no) &&
     (contentWarnings = tidyLoadConfig(_contentErrors,"/etc/tidy.conf"), pFVar2 = errout,
     contentWarnings != 0)) {
    ptVar6 = tidyLocalizedString(0x310);
    fprintf((FILE *)pFVar2,ptVar6,"/etc/tidy.conf",(ulong)contentWarnings);
    fprintf((FILE *)errout,anon_var_dwarf_13102 + 0x15d);
  }
  errfil = getenv("HTML_TIDY");
  if (errfil == (char *)0x0) {
    BVar3 = tidyFileExists(_contentErrors,"~/.tidyrc");
    if ((BVar3 != no) &&
       (contentWarnings = tidyLoadConfig(_contentErrors,"~/.tidyrc"), pFVar2 = errout,
       contentWarnings != 0)) {
      ptVar6 = tidyLocalizedString(0x310);
      fprintf((FILE *)pFVar2,ptVar6,"~/.tidyrc",(ulong)contentWarnings);
      fprintf((FILE *)errout,anon_var_dwarf_13102 + 0x15d);
    }
  }
  else {
    contentWarnings = tidyLoadConfig(_contentErrors,errfil);
    pFVar2 = errout;
    if (contentWarnings != 0) {
      ptVar6 = tidyLocalizedString(0x310);
      fprintf((FILE *)pFVar2,ptVar6,errfil,(ulong)contentWarnings);
      fprintf((FILE *)errout,anon_var_dwarf_13102 + 0x15d);
    }
  }
  do {
    while( true ) {
      if ((int)argv_local < 1) goto LAB_00132603;
      if (((int)argv_local < 2) || (**(char **)(prog + 8) != '-')) break;
      post = (ctmbstr)(*(long *)(prog + 8) + 1);
      iVar4 = strcasecmp(post,"xml");
      if (iVar4 == 0) {
        tidyOptSetBool(_contentErrors,TidyXmlTags,yes);
      }
      else {
        iVar4 = strcasecmp(post,"asxml");
        if ((iVar4 == 0) || (iVar4 = strcasecmp(post,"asxhtml"), iVar4 == 0)) {
          tidyOptSetBool(_contentErrors,TidyXhtmlOut,yes);
        }
        else {
          iVar4 = strcasecmp(post,"ashtml");
          if (iVar4 == 0) {
            tidyOptSetBool(_contentErrors,TidyHtmlOut,yes);
          }
          else {
            iVar4 = strcasecmp(post,"indent");
            if (iVar4 == 0) {
              tidyOptSetInt(_contentErrors,TidyIndentContent,2);
              uVar7 = tidyOptGetInt(_contentErrors,TidyIndentSpaces);
              if (uVar7 == 0) {
                tidyOptResetToDefault(_contentErrors,TidyIndentSpaces);
              }
            }
            else {
              iVar4 = strcasecmp(post,"omit");
              if (iVar4 == 0) {
                tidyOptSetBool(_contentErrors,TidyOmitOptionalTags,yes);
              }
              else {
                iVar4 = strcasecmp(post,"upper");
                if (iVar4 == 0) {
                  tidyOptSetBool(_contentErrors,TidyUpperCaseTags,yes);
                }
                else {
                  iVar4 = strcasecmp(post,"clean");
                  if (iVar4 == 0) {
                    tidyOptSetBool(_contentErrors,TidyMakeClean,yes);
                  }
                  else {
                    iVar4 = strcasecmp(post,"gdoc");
                    if (iVar4 == 0) {
                      tidyOptSetBool(_contentErrors,TidyGDocClean,yes);
                    }
                    else {
                      iVar4 = strcasecmp(post,"bare");
                      if (iVar4 == 0) {
                        tidyOptSetBool(_contentErrors,TidyMakeBare,yes);
                      }
                      else {
                        iVar4 = strcasecmp(post,"raw");
                        if ((((((iVar4 == 0) || (iVar4 = strcasecmp(post,"ascii"), iVar4 == 0)) ||
                              ((iVar4 = strcasecmp(post,"latin0"), iVar4 == 0 ||
                               (((((iVar4 = strcasecmp(post,"latin1"), iVar4 == 0 ||
                                   (iVar4 = strcasecmp(post,"utf8"), iVar4 == 0)) ||
                                  (iVar4 = strcasecmp(post,"iso2022"), iVar4 == 0)) ||
                                 ((iVar4 = strcasecmp(post,"utf16le"), iVar4 == 0 ||
                                  (iVar4 = strcasecmp(post,"utf16be"), iVar4 == 0)))) ||
                                (iVar4 = strcasecmp(post,"utf16"), iVar4 == 0)))))) ||
                             ((iVar4 = strcasecmp(post,"shiftjis"), iVar4 == 0 ||
                              (iVar4 = strcasecmp(post,"big5"), iVar4 == 0)))) ||
                            (iVar4 = strcasecmp(post,"mac"), iVar4 == 0)) ||
                           ((iVar4 = strcasecmp(post,"win1252"), iVar4 == 0 ||
                            (iVar4 = strcasecmp(post,"ibm858"), iVar4 == 0)))) {
                          tidySetCharEncoding(_contentErrors,post);
                        }
                        else {
                          iVar4 = strcasecmp(post,"numeric");
                          if (iVar4 == 0) {
                            tidyOptSetBool(_contentErrors,TidyNumEntities,yes);
                          }
                          else {
                            iVar4 = strcasecmp(post,"modify");
                            if (((iVar4 == 0) || (iVar4 = strcasecmp(post,"change"), iVar4 == 0)) ||
                               (iVar4 = strcasecmp(post,"update"), iVar4 == 0)) {
                              tidyOptSetBool(_contentErrors,TidyWriteBack,yes);
                            }
                            else {
                              iVar4 = strcasecmp(post,"errors");
                              if (iVar4 == 0) {
                                tidyOptSetBool(_contentErrors,TidyShowMarkup,no);
                              }
                              else {
                                iVar4 = strcasecmp(post,"quiet");
                                if (iVar4 == 0) {
                                  tidyOptSetBool(_contentErrors,TidyQuiet,yes);
                                }
                                else {
                                  iVar4 = strcasecmp(post,"language");
                                  if ((iVar4 == 0) || (iVar4 = strcasecmp(post,"lang"), iVar4 == 0))
                                  {
                                    if ((int)argv_local < 3) {
                                      ptVar6 = tidyLocalizedString(0x348);
                                      printf("%s\n",ptVar6);
                                    }
                                    else {
                                      iVar4 = strcasecmp(*(char **)(prog + 0x10),"help");
                                      if (iVar4 == 0) {
                                        lang_help(_contentErrors);
                                        exit(0);
                                      }
                                      BVar3 = tidySetLanguage(*(ctmbstr *)(prog + 0x10));
                                      if (BVar3 == no) {
                                        ptVar6 = tidyLocalizedString(0x349);
                                        uVar1 = *(undefined8 *)(prog + 0x10);
                                        ptVar8 = tidyGetLanguage();
                                        printf(ptVar6,uVar1,ptVar8);
                                        printf(anon_var_dwarf_13102 + 0x15d);
                                      }
                                      argv_local._0_4_ = (int)argv_local + -1;
                                      prog = prog + 8;
                                    }
                                  }
                                  else {
                                    iVar4 = strcasecmp(post,"help");
                                    if (((iVar4 == 0) ||
                                        (iVar4 = strcasecmp(post,"-help"), iVar4 == 0)) ||
                                       ((iVar4 = strcasecmp(post,"h"), iVar4 == 0 || (*post == '?'))
                                       )) {
                                      help(_contentErrors,cfgfil);
                                      tidyRelease(_contentErrors);
                                      return 0;
                                    }
                                    iVar4 = strcasecmp(post,"xml-help");
                                    if (iVar4 == 0) {
                                      xml_help();
                                      tidyRelease(_contentErrors);
                                      return 0;
                                    }
                                    iVar4 = strcasecmp(post,"xml-error-strings");
                                    if (iVar4 == 0) {
                                      xml_error_strings(_contentErrors);
                                      tidyRelease(_contentErrors);
                                      return 0;
                                    }
                                    iVar4 = strcasecmp(post,"xml-options-strings");
                                    if (iVar4 == 0) {
                                      xml_options_strings(_contentErrors);
                                      tidyRelease(_contentErrors);
                                      return 0;
                                    }
                                    iVar4 = strcasecmp(post,"xml-strings");
                                    if (iVar4 == 0) {
                                      xml_strings();
                                      tidyRelease(_contentErrors);
                                      return 0;
                                    }
                                    iVar4 = strcasecmp(post,"help-config");
                                    if (iVar4 == 0) {
                                      optionhelp(_contentErrors);
                                      tidyRelease(_contentErrors);
                                      return 0;
                                    }
                                    iVar4 = strcasecmp(post,"help-env");
                                    if (iVar4 == 0) {
                                      helpEnv(_contentErrors);
                                      tidyRelease(_contentErrors);
                                      return 0;
                                    }
                                    iVar4 = strcasecmp(post,"help-option");
                                    if (iVar4 == 0) {
                                      if ((int)argv_local < 3) {
                                        ptVar6 = tidyLocalizedString(0x34a);
                                        printf("%s\n",ptVar6);
                                      }
                                      else {
                                        optionDescribe(_contentErrors,*(char **)(prog + 0x10));
                                      }
                                      tidyRelease(_contentErrors);
                                      return 0;
                                    }
                                    iVar4 = strcasecmp(post,"xml-config");
                                    if (iVar4 == 0) {
                                      XMLoptionhelp(_contentErrors);
                                      tidyRelease(_contentErrors);
                                      return 0;
                                    }
                                    iVar4 = strcasecmp(post,"show-config");
                                    if (iVar4 == 0) {
                                      optionvalues(_contentErrors);
                                      tidyRelease(_contentErrors);
                                      return 0;
                                    }
                                    iVar4 = strcasecmp(post,"export-config");
                                    if (iVar4 == 0) {
                                      exportOptionValues(_contentErrors);
                                      tidyRelease(_contentErrors);
                                      return 0;
                                    }
                                    iVar4 = strcasecmp(post,"export-default-config");
                                    if (iVar4 == 0) {
                                      exportDefaultOptionValues(_contentErrors);
                                      tidyRelease(_contentErrors);
                                      return 0;
                                    }
                                    iVar4 = strcasecmp(post,"config");
                                    if (iVar4 == 0) {
                                      if (2 < (int)argv_local) {
                                        tidyLoadConfig(_contentErrors,*(ctmbstr *)(prog + 0x10));
                                        _nfields = tidyOptGetValue(_contentErrors,TidyErrFile);
                                        if ((_nfields != (ctmbstr)0x0) &&
                                           ((htmlfil == (ctmbstr)0x0 ||
                                            (BVar3 = samefile(htmlfil,_nfields), BVar3 == no)))) {
                                          htmlfil = _nfields;
                                          errout = tidySetErrorFile(_contentErrors,_nfields);
                                        }
                                        argv_local._0_4_ = (int)argv_local + -1;
                                        prog = prog + 8;
                                      }
                                    }
                                    else {
                                      iVar4 = strcasecmp(post,"output");
                                      if (((iVar4 == 0) ||
                                          (iVar4 = strcasecmp(post,"-output-file"), iVar4 == 0)) ||
                                         (iVar4 = strcasecmp(post,"o"), iVar4 == 0)) {
                                        if (2 < (int)argv_local) {
                                          tidyOptSetValue(_contentErrors,TidyOutFile,
                                                          *(ctmbstr *)(prog + 0x10));
                                          argv_local._0_4_ = (int)argv_local + -1;
                                          prog = prog + 8;
                                        }
                                      }
                                      else {
                                        iVar4 = strcasecmp(post,"file");
                                        if (((iVar4 == 0) ||
                                            (iVar4 = strcasecmp(post,"-file"), iVar4 == 0)) ||
                                           (iVar4 = strcasecmp(post,"f"), iVar4 == 0)) {
                                          if (2 < (int)argv_local) {
                                            htmlfil = *(ctmbstr *)(prog + 0x10);
                                            errout = tidySetErrorFile(_contentErrors,htmlfil);
                                            argv_local._0_4_ = (int)argv_local + -1;
                                            prog = prog + 8;
                                          }
                                        }
                                        else {
                                          iVar4 = strcasecmp(post,"wrap");
                                          if (((iVar4 == 0) ||
                                              (iVar4 = strcasecmp(post,"-wrap"), iVar4 == 0)) ||
                                             (iVar4 = strcasecmp(post,"w"), iVar4 == 0)) {
                                            if (2 < (int)argv_local) {
                                              post_1._4_4_ = 0;
                                              post_1._0_4_ = __isoc99_sscanf(*(undefined8 *)
                                                                              (prog + 0x10),"%u",
                                                                             (long)&post_1 + 4);
                                              tidyOptSetInt(_contentErrors,TidyWrapLen,
                                                            (ulong)post_1._4_4_);
                                              if (0 < (int)post_1) {
                                                argv_local._0_4_ = (int)argv_local + -1;
                                                prog = prog + 8;
                                              }
                                            }
                                          }
                                          else {
                                            iVar4 = strcasecmp(post,"version");
                                            if (((iVar4 == 0) ||
                                                (iVar4 = strcasecmp(post,"-version"), iVar4 == 0))
                                               || (iVar4 = strcasecmp(post,"v"), iVar4 == 0)) {
                                              version(_contentErrors);
                                              tidyRelease(_contentErrors);
                                              return 0;
                                            }
                                            iVar4 = strncmp(*(char **)(prog + 8),"--",2);
                                            if (iVar4 == 0) {
                                              BVar3 = tidyOptParseValue(_contentErrors,
                                                                        (ctmbstr)(*(long *)(prog + 8
                                                  ) + 2),*(ctmbstr *)(prog + 0x10));
                                              if (BVar3 != no) {
                                                _nfields_1 = tidyOptGetValue(_contentErrors,
                                                                             TidyErrFile);
                                                if ((_nfields_1 != (ctmbstr)0x0) &&
                                                   ((htmlfil == (ctmbstr)0x0 ||
                                                    (BVar3 = samefile(htmlfil,_nfields_1),
                                                    BVar3 == no)))) {
                                                  htmlfil = _nfields_1;
                                                  errout = tidySetErrorFile(_contentErrors,
                                                                            _nfields_1);
                                                }
                                                prog = prog + 8;
                                                argv_local._0_4_ = (int)argv_local + -1;
                                              }
                                            }
                                            else {
                                              iVar4 = strcasecmp(post,"access");
                                              if (iVar4 == 0) {
                                                if (2 < (int)argv_local) {
                                                  c = 0;
                                                  iVar4 = __isoc99_sscanf(*(undefined8 *)
                                                                           (prog + 0x10),"%u",&c);
                                                  tidyOptSetInt(_contentErrors,
                                                                TidyAccessibilityCheckLevel,(ulong)c
                                                               );
                                                  if (0 < iVar4) {
                                                    argv_local._0_4_ = (int)argv_local + -1;
                                                    prog = prog + 8;
                                                  }
                                                }
                                              }
                                              else {
                                                outfil = *(ctmbstr *)(prog + 8);
                                                while( true ) {
                                                  ptVar6 = outfil + 1;
                                                  uVar5 = (uint)outfil[1];
                                                  if (uVar5 == 0) break;
                                                  outfil = ptVar6;
                                                  switch(uVar5) {
                                                  case 0x62:
                                                    tidyOptSetBool(_contentErrors,TidyMakeBare,yes);
                                                    break;
                                                  case 99:
                                                    tidyOptSetBool(_contentErrors,TidyMakeClean,yes)
                                                    ;
                                                    break;
                                                  default:
                                                    unknownOption(_contentErrors,uVar5);
                                                    break;
                                                  case 0x65:
                                                    tidyOptSetBool(_contentErrors,TidyShowMarkup,no)
                                                    ;
                                                    break;
                                                  case 0x67:
                                                    tidyOptSetBool(_contentErrors,TidyGDocClean,yes)
                                                    ;
                                                    break;
                                                  case 0x69:
                                                    tidyOptSetInt(_contentErrors,TidyIndentContent,2
                                                                 );
                                                    uVar7 = tidyOptGetInt(_contentErrors,
                                                                          TidyIndentSpaces);
                                                    if (uVar7 == 0) {
                                                      tidyOptResetToDefault
                                                                (_contentErrors,TidyIndentSpaces);
                                                    }
                                                    break;
                                                  case 0x6d:
                                                    tidyOptSetBool(_contentErrors,TidyWriteBack,yes)
                                                    ;
                                                    break;
                                                  case 0x6e:
                                                    tidyOptSetBool(_contentErrors,TidyNumEntities,
                                                                   yes);
                                                    break;
                                                  case 0x71:
                                                    tidyOptSetBool(_contentErrors,TidyQuiet,yes);
                                                    break;
                                                  case 0x75:
                                                    tidyOptSetBool(_contentErrors,TidyUpperCaseTags,
                                                                   yes);
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      argv_local._0_4_ = (int)argv_local + -1;
      prog = prog + 8;
    }
    if ((int)argv_local < 2) {
      tdoc = (TidyDoc)anon_var_dwarf_3ef;
      contentWarnings = tidyParseStdin(_contentErrors);
    }
    else {
      tdoc = *(TidyDoc *)(prog + 8);
      BVar3 = tidyOptGetBool(_contentErrors,TidyShowFilename);
      if (BVar3 != no) {
        fprintf((FILE *)errout,"Tidy: \'%s\'",tdoc);
        fprintf((FILE *)errout,anon_var_dwarf_13102 + 0x15d);
      }
      BVar3 = tidyOptGetBool(_contentErrors,TidyEmacs);
      if ((BVar3 != no) || (BVar3 = tidyOptGetBool(_contentErrors,TidyShowFilename), BVar3 != no)) {
        tidySetEmacsFile(_contentErrors,(ctmbstr)tdoc);
      }
      contentWarnings = tidyParseFile(_contentErrors,(ctmbstr)tdoc);
    }
    if (-1 < (int)contentWarnings) {
      contentWarnings = tidyCleanAndRepair(_contentErrors);
    }
    if (-1 < (int)contentWarnings) {
      contentWarnings = tidyRunDiagnostics(_contentErrors);
    }
    if (1 < (int)contentWarnings) {
      BVar3 = tidyOptGetBool(_contentErrors,TidyForceOutput);
      if (BVar3 == no) {
        local_c4 = 0xffffffff;
      }
      else {
        local_c4 = contentWarnings;
      }
      contentWarnings = local_c4;
    }
    if ((-1 < (int)contentWarnings) &&
       (BVar3 = tidyOptGetBool(_contentErrors,TidyShowMarkup), BVar3 != no)) {
      BVar3 = tidyOptGetBool(_contentErrors,TidyWriteBack);
      if ((BVar3 == no) || ((int)argv_local < 2)) {
        ptVar6 = tidyOptGetValue(_contentErrors,TidyOutFile);
        if (ptVar6 == (ctmbstr)0x0) {
          contentWarnings = tidySaveStdout(_contentErrors);
        }
        else {
          contentWarnings = tidySaveFile(_contentErrors,ptVar6);
        }
      }
      else {
        contentWarnings = tidySaveFile(_contentErrors,(ctmbstr)tdoc);
      }
    }
    uVar5 = tidyErrorCount(_contentErrors);
    accessWarnings = uVar5 + accessWarnings;
    uVar5 = tidyWarningCount(_contentErrors);
    arg._4_4_ = uVar5 + arg._4_4_;
    uVar5 = tidyAccessWarningCount(_contentErrors);
    arg._0_4_ = uVar5 + (int)arg;
    argv_local._0_4_ = (int)argv_local + -1;
    prog = prog + 8;
  } while (1 < (int)argv_local);
LAB_00132603:
  if (((errout == _stderr) && (accessWarnings == 0)) &&
     (BVar3 = tidyOptGetBool(_contentErrors,TidyQuiet), BVar3 == no)) {
    fprintf((FILE *)errout,anon_var_dwarf_13102 + 0x15d);
  }
  if (accessWarnings + arg._4_4_ != 0) {
    tidyErrorSummary(_contentErrors);
  }
  tidyGeneralInfo(_contentErrors);
  tidyRelease(_contentErrors);
  if (accessWarnings == 0) {
    if (arg._4_4_ == 0) {
      argv_local._4_4_ = 0;
    }
    else {
      argv_local._4_4_ = 1;
    }
  }
  else {
    argv_local._4_4_ = 2;
  }
  return argv_local._4_4_;
}

Assistant:

int main( int argc, char** argv )
{
    ctmbstr prog = argv[0];
    ctmbstr cfgfil = NULL, errfil = NULL, htmlfil = NULL;
    TidyDoc tdoc = NULL;
    int status = 0;

    uint contentErrors = 0;
    uint contentWarnings = 0;
    uint accessWarnings = 0;

#if defined(ENABLE_DEBUG_LOG) && defined(_MSC_VER)
#  if defined(_CRTDBG_MAP_ALLOC)
    _CrtSetDbgFlag(_CRTDBG_ALLOC_MEM_DF | _CRTDBG_LEAK_CHECK_DF);
#  endif
#endif

    tdoc = tidyCreate();

    tidySetMessageCallback( tdoc, reportCallback); /* experimental group */
    errout = stderr;  /* initialize to stderr */

    /* Set an atexit handler. */
    atexit( tidy_cleanup );

#if defined(_WIN32)
    /* Force Windows console to use UTF, otherwise many characters will
     * be garbage. Note that East Asian languages *are* supported, but
     * only when Windows OS locale (not console only!) is set to an
     * East Asian language.
     */
    win_cp = GetConsoleOutputCP();
    SetConsoleOutputCP(CP_UTF8);
#endif

    /*
     * Look for default configuration files using any of
     * the following possibilities:
     *  - TIDY_CONFIG_FILE - from tidyplatform.h, typically /etc/tidy.conf
     *  - HTML_TIDY        - environment variable
     *  - TIDY_USER_CONFIG_FILE - from tidyplatform.h, typically ~/tidy.conf
     */

#ifdef TIDY_CONFIG_FILE
    if ( tidyFileExists( tdoc, TIDY_CONFIG_FILE) )
    {
        status = tidyLoadConfig( tdoc, TIDY_CONFIG_FILE );
        if ( status != 0 ) {
            fprintf(errout, tidyLocalizedString( TC_MAIN_ERROR_LOAD_CONFIG ), TIDY_CONFIG_FILE, status);
            fprintf(errout, "\n");
        }
    }
#endif /* TIDY_CONFIG_FILE */

    if ( (cfgfil = getenv("HTML_TIDY")) != NULL )
    {
        status = tidyLoadConfig( tdoc, cfgfil );
        if ( status != 0 ) {
            fprintf(errout, tidyLocalizedString( TC_MAIN_ERROR_LOAD_CONFIG ), cfgfil, status);
            fprintf(errout, "\n");
        }
    }
#ifdef TIDY_USER_CONFIG_FILE
    else if ( tidyFileExists( tdoc, TIDY_USER_CONFIG_FILE) )
    {
        status = tidyLoadConfig( tdoc, TIDY_USER_CONFIG_FILE );
        if ( status != 0 ) {
            fprintf(errout, tidyLocalizedString( TC_MAIN_ERROR_LOAD_CONFIG ), TIDY_USER_CONFIG_FILE, status);
            fprintf(errout, "\n");
        }
    }
#endif /* TIDY_USER_CONFIG_FILE */


    /*
     * Read command line
     */

    while ( argc > 0 )
    {
        if (argc > 1 && argv[1][0] == '-')
        {
            /* support -foo and --foo */
            ctmbstr arg = argv[1] + 1;

            if ( strcasecmp(arg, "xml") == 0)
                tidyOptSetBool( tdoc, TidyXmlTags, yes );

            else if ( strcasecmp(arg,   "asxml") == 0 ||
                     strcasecmp(arg, "asxhtml") == 0 )
            {
                tidyOptSetBool( tdoc, TidyXhtmlOut, yes );
            }
            else if ( strcasecmp(arg,   "ashtml") == 0 )
                tidyOptSetBool( tdoc, TidyHtmlOut, yes );

            else if ( strcasecmp(arg, "indent") == 0 )
            {
                tidyOptSetInt( tdoc, TidyIndentContent, TidyAutoState );
                if ( tidyOptGetInt(tdoc, TidyIndentSpaces) == 0 )
                    tidyOptResetToDefault( tdoc, TidyIndentSpaces );
            }
            else if ( strcasecmp(arg, "omit") == 0 )
                tidyOptSetBool( tdoc, TidyOmitOptionalTags, yes );

            else if ( strcasecmp(arg, "upper") == 0 )
                tidyOptSetBool( tdoc, TidyUpperCaseTags, yes );

            else if ( strcasecmp(arg, "clean") == 0 )
                tidyOptSetBool( tdoc, TidyMakeClean, yes );

            else if ( strcasecmp(arg, "gdoc") == 0 )
                tidyOptSetBool( tdoc, TidyGDocClean, yes );

            else if ( strcasecmp(arg, "bare") == 0 )
                tidyOptSetBool( tdoc, TidyMakeBare, yes );

            else if ( strcasecmp(arg, "raw") == 0     ||
                     strcasecmp(arg, "ascii") == 0    ||
                     strcasecmp(arg, "latin0") == 0   ||
                     strcasecmp(arg, "latin1") == 0   ||
                     strcasecmp(arg, "utf8") == 0     ||
#ifndef NO_NATIVE_ISO2022_SUPPORT
                     strcasecmp(arg, "iso2022") == 0  ||
#endif
                     strcasecmp(arg, "utf16le") == 0  ||
                     strcasecmp(arg, "utf16be") == 0  ||
                     strcasecmp(arg, "utf16") == 0    ||
                     strcasecmp(arg, "shiftjis") == 0 ||
                     strcasecmp(arg, "big5") == 0     ||
                     strcasecmp(arg, "mac") == 0      ||
                     strcasecmp(arg, "win1252") == 0  ||
                     strcasecmp(arg, "ibm858") == 0 )
            {
                tidySetCharEncoding( tdoc, arg );
            }
            else if ( strcasecmp(arg, "numeric") == 0 )
                tidyOptSetBool( tdoc, TidyNumEntities, yes );

            else if ( strcasecmp(arg, "modify") == 0 ||
                     strcasecmp(arg, "change") == 0 ||  /* obsolete */
                     strcasecmp(arg, "update") == 0 )   /* obsolete */
            {
                tidyOptSetBool( tdoc, TidyWriteBack, yes );
            }
            else if ( strcasecmp(arg, "errors") == 0 )
                tidyOptSetBool( tdoc, TidyShowMarkup, no );

            else if ( strcasecmp(arg, "quiet") == 0 )
                tidyOptSetBool( tdoc, TidyQuiet, yes );

            /* Currenly user must specify a language
             prior to anything that causes output */
            else if ( strcasecmp(arg, "language") == 0 ||
                     strcasecmp(arg,     "lang") == 0 )
                if ( argc >= 3)
                {
                    if ( strcasecmp(argv[2], "help") == 0 )
                    {
                        lang_help( tdoc );
                        exit(0);
                    }
                    if ( !tidySetLanguage( argv[2] ) )
                    {
                        printf(tidyLocalizedString(TC_STRING_LANG_NOT_FOUND),
                               argv[2], tidyGetLanguage());
                        printf("\n");
                    }
                    --argc;
                    ++argv;
                }
                else
                {
                    printf( "%s\n", tidyLocalizedString(TC_STRING_LANG_MUST_SPECIFY));
                }

            else if ( strcasecmp(arg, "help") == 0 ||
                        strcasecmp(arg, "-help") == 0 ||
                        strcasecmp(arg,    "h") == 0 || *arg == '?' )
            {
                help( tdoc, prog );
                tidyRelease( tdoc );
                return 0; /* success */
            }
            else if ( strcasecmp(arg, "xml-help") == 0)
            {
                xml_help( );
                tidyRelease( tdoc );
                return 0; /* success */
            }
            else if ( strcasecmp(arg, "xml-error-strings") == 0)
            {
                xml_error_strings( tdoc );
                tidyRelease( tdoc );
                return 0; /* success */
            }
            else if ( strcasecmp(arg, "xml-options-strings") == 0)
            {
                xml_options_strings( tdoc );
                tidyRelease( tdoc );
                return 0; /* success */
            }
            else if ( strcasecmp(arg, "xml-strings") == 0)
            {
                xml_strings( );
                tidyRelease( tdoc );
                return 0; /* success */
            }
            else if ( strcasecmp(arg, "help-config") == 0 )
            {
                optionhelp( tdoc );
                tidyRelease( tdoc );
                return 0; /* success */
            }
            else if ( strcasecmp(arg, "help-env") == 0 )
            {
                helpEnv( tdoc );
                tidyRelease( tdoc );
                return 0; /* success */
            }
            else if ( strcasecmp(arg, "help-option") == 0 )
            {
                if ( argc >= 3)
                {
                    optionDescribe( tdoc, argv[2] );
                }
                else
                {
                    printf( "%s\n", tidyLocalizedString(TC_STRING_MUST_SPECIFY));
                }
                tidyRelease( tdoc );
                return 0; /* success */
            }
            else if ( strcasecmp(arg, "xml-config") == 0 )
            {
                XMLoptionhelp( tdoc );
                tidyRelease( tdoc );
                return 0; /* success */
            }
            else if ( strcasecmp(arg, "show-config") == 0 )
            {
                optionvalues( tdoc );
                tidyRelease( tdoc );
                return 0; /* success */
            }
            else if ( strcasecmp(arg, "export-config") == 0 )
            {
                exportOptionValues( tdoc );
                tidyRelease( tdoc );
                return 0; /* success */
            }
            else if ( strcasecmp(arg, "export-default-config") == 0 )
            {
                exportDefaultOptionValues( tdoc );
                tidyRelease( tdoc );
                return 0; /* success */
            }
            else if ( strcasecmp(arg, "config") == 0 )
            {
                if ( argc >= 3 )
                {
                    ctmbstr post;

                    tidyLoadConfig( tdoc, argv[2] );

                    /* Set new error output stream if setting changed */
                    post = tidyOptGetValue( tdoc, TidyErrFile );
                    if ( post && (!errfil || !samefile(errfil, post)) )
                    {
                        errfil = post;
                        errout = tidySetErrorFile( tdoc, post );
                    }

                    --argc;
                    ++argv;
                }
            }

            else if ( strcasecmp(arg, "output") == 0 ||
                        strcasecmp(arg, "-output-file") == 0 ||
                        strcasecmp(arg, "o") == 0 )
            {
                if ( argc >= 3 )
                {
                    tidyOptSetValue( tdoc, TidyOutFile, argv[2] );
                    --argc;
                    ++argv;
                }
            }
            else if ( strcasecmp(arg,  "file") == 0 ||
                        strcasecmp(arg, "-file") == 0 ||
                        strcasecmp(arg,     "f") == 0 )
            {
                if ( argc >= 3 )
                {
                    errfil = argv[2];
                    errout = tidySetErrorFile( tdoc, errfil );
                    --argc;
                    ++argv;
                }
            }
            else if ( strcasecmp(arg,  "wrap") == 0 ||
                        strcasecmp(arg, "-wrap") == 0 ||
                        strcasecmp(arg,     "w") == 0 )
            {
                if ( argc >= 3 )
                {
                    uint wraplen = 0;
                    int nfields = sscanf( argv[2], "%u", &wraplen );
                    tidyOptSetInt( tdoc, TidyWrapLen, wraplen );
                    if (nfields > 0)
                    {
                        --argc;
                        ++argv;
                    }
                }
            }
            else if ( strcasecmp(arg,  "version") == 0 ||
                        strcasecmp(arg, "-version") == 0 ||
                        strcasecmp(arg,        "v") == 0 )
            {
                version( tdoc );
                tidyRelease( tdoc );
                return 0;  /* success */

            }
            else if ( strncmp(argv[1], "--", 2 ) == 0)
            {
                if ( tidyOptParseValue(tdoc, argv[1]+2, argv[2]) )
                {
                    /* Set new error output stream if setting changed */
                    ctmbstr post = tidyOptGetValue( tdoc, TidyErrFile );
                    if ( post && (!errfil || !samefile(errfil, post)) )
                    {
                        errfil = post;
                        errout = tidySetErrorFile( tdoc, post );
                    }

                    ++argv;
                    --argc;
                }
            }
                else if ( strcasecmp(arg, "access") == 0 )
                {
                    if ( argc >= 3 )
                    {
                        uint acclvl = 0;
                        int nfields = sscanf( argv[2], "%u", &acclvl );
                        tidyOptSetInt( tdoc, TidyAccessibilityCheckLevel, acclvl );
                        if (nfields > 0)
                        {
                            --argc;
                            ++argv;
                        }
                    }
                }

                else
                {
                    uint c;
                    ctmbstr s = argv[1];

                    while ( (c = *++s) != '\0' )
                    {
                        switch ( c )
                        {
                            case 'i':
                                tidyOptSetInt( tdoc, TidyIndentContent, TidyAutoState );
                                if ( tidyOptGetInt(tdoc, TidyIndentSpaces) == 0 )
                                    tidyOptResetToDefault( tdoc, TidyIndentSpaces );
                                break;

                            case 'u':
                                tidyOptSetBool( tdoc, TidyUpperCaseTags, yes );
                                break;

                            case 'c':
                                tidyOptSetBool( tdoc, TidyMakeClean, yes );
                                break;

                            case 'g':
                                tidyOptSetBool( tdoc, TidyGDocClean, yes );
                                break;

                            case 'b':
                                tidyOptSetBool( tdoc, TidyMakeBare, yes );
                                break;

                            case 'n':
                                tidyOptSetBool( tdoc, TidyNumEntities, yes );
                                break;

                            case 'm':
                                tidyOptSetBool( tdoc, TidyWriteBack, yes );
                                break;

                            case 'e':
                                tidyOptSetBool( tdoc, TidyShowMarkup, no );
                                break;

                            case 'q':
                                tidyOptSetBool( tdoc, TidyQuiet, yes );
                                break;

                            default:
                                unknownOption( tdoc, c );
                                break;
                        }
                    }
                }

            --argc;
            ++argv;
            continue;
        }


        if ( argc > 1 )
        {
            htmlfil = argv[1];
#ifdef ENABLE_DEBUG_LOG
            SPRTF("Tidy: '%s'\n", htmlfil);
#else /* !ENABLE_DEBUG_LOG */
            /* Is #713 - show-filename option */
            if (tidyOptGetBool(tdoc, TidyShowFilename))
            {
                fprintf(errout, "Tidy: '%s'", htmlfil);
                fprintf(errout, "\n");
            }
#endif /* ENABLE_DEBUG_LOG yes/no */
            if ( tidyOptGetBool(tdoc, TidyEmacs) || tidyOptGetBool(tdoc, TidyShowFilename))
                tidySetEmacsFile( tdoc, htmlfil );
            status = tidyParseFile( tdoc, htmlfil );
        }
        else
        {
            htmlfil = "stdin";
            status = tidyParseStdin( tdoc );
        }

        if ( status >= 0 )
            status = tidyCleanAndRepair( tdoc );

        if ( status >= 0 ) {
            status = tidyRunDiagnostics( tdoc );
        }
        if ( status > 1 ) /* If errors, do we want to force output? */
            status = ( tidyOptGetBool(tdoc, TidyForceOutput) ? status : -1 );

        if ( status >= 0 && tidyOptGetBool(tdoc, TidyShowMarkup) )
        {
            if ( tidyOptGetBool(tdoc, TidyWriteBack) && argc > 1 )
                status = tidySaveFile( tdoc, htmlfil );
            else
            {
                ctmbstr outfil = tidyOptGetValue( tdoc, TidyOutFile );
                if ( outfil ) {
                    status = tidySaveFile( tdoc, outfil );
                } else {
#ifdef ENABLE_DEBUG_LOG
                    static char tmp_buf[264];
                    sprintf(tmp_buf,"%s.html",get_log_file());
                    status = tidySaveFile( tdoc, tmp_buf );
                    SPRTF("Saved tidied content to '%s'\n",tmp_buf);
#else
                    status = tidySaveStdout( tdoc );
#endif
                }
            }
        }
        
        contentErrors   += tidyErrorCount( tdoc );
        contentWarnings += tidyWarningCount( tdoc );
        accessWarnings  += tidyAccessWarningCount( tdoc );
        
        --argc;
        ++argv;
        
        if ( argc <= 1 )
            break;
    } /* read command line loop */

    /* blank line for screen formatting */
    if ( errout == stderr && !contentErrors && !tidyOptGetBool( tdoc, TidyQuiet ) )
        fprintf(errout, "\n");

    /* footnote printing only if errors or warnings */
    if ( contentErrors + contentWarnings > 0 )
        tidyErrorSummary(tdoc);

    /* prints the general info, if applicable */
    tidyGeneralInfo(tdoc);

    /* called to free hash tables etc. */
    tidyRelease( tdoc );
    
    /* return status can be used by scripts */
    if ( contentErrors > 0 )
        return 2;
    
    if ( contentWarnings > 0 )
        return 1;
    
    /* 0 signifies all is ok */
    return 0;
}